

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O0

void __thiscall
Object::makePolygons4Render
          (Object *this,Vector2d *obs,
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          *polygons)

{
  bool bVar1;
  _Self *__args;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *this_00;
  long in_RDI;
  Vector3d *p;
  const_iterator __end2;
  const_iterator __begin2;
  Edge *__range2;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *back;
  Edge *eg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Edge,_std::allocator<Edge>_> *__range1;
  _Self *in_stack_ffffffffffffff48;
  _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
  *in_stack_ffffffffffffff50;
  _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
  local_68;
  reference local_48;
  _Self *local_40;
  reference local_38;
  Edge *local_30;
  __normal_iterator<const_Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_> local_28;
  long local_20;
  
  local_20 = in_RDI + 0x10;
  local_28._M_current =
       (Edge *)std::vector<Edge,_std::allocator<Edge>_>::begin
                         ((vector<Edge,_std::allocator<Edge>_> *)in_stack_ffffffffffffff48);
  local_30 = (Edge *)std::vector<Edge,_std::allocator<Edge>_>::end
                               ((vector<Edge,_std::allocator<Edge>_> *)in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<const_Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    local_38 = __gnu_cxx::__normal_iterator<const_Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
               ::operator*(&local_28);
    if ((local_38->valid & 1U) != 0) {
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::emplace_back<>((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        *)in_stack_ffffffffffffff50);
      __args = (_Self *)std::
                        vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ::back((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                *)in_stack_ffffffffffffff50);
      local_40 = __args;
      this_00 = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                          ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x14b1a2);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x14b1b1);
      std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<double&,double&>
                (this_00,(double *)__args,(double *)in_stack_ffffffffffffff50);
      local_48 = local_38;
      std::
      deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::begin((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)in_stack_ffffffffffffff48);
      std::
      deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::end((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)in_stack_ffffffffffffff48);
      while (bVar1 = std::operator!=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48), bVar1) {
        std::
        _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
        ::operator*(&local_68);
        in_stack_ffffffffffffff48 = local_40;
        in_stack_ffffffffffffff50 =
             (_Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
              *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::x
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x14b225);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::y
                  ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x14b234);
        std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
        emplace_back<double_const&,double_const&>
                  (this_00,(double *)__args,(double *)in_stack_ffffffffffffff50);
        std::
        _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
        ::operator++(in_stack_ffffffffffffff50);
      }
    }
    __gnu_cxx::__normal_iterator<const_Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
    operator++(&local_28);
  }
  return;
}

Assistant:

void Object::makePolygons4Render(Eigen::Vector2d obs, std::vector<std::vector<cv::Point>>& polygons) const{
    for (const Edge& eg: edges) {
        if (eg.valid == false) continue;
        polygons.emplace_back();
        std::vector<cv::Point>& back = polygons.back();
        back.emplace_back(obs.x(), obs.y());
        for (const Eigen::Vector3d& p: eg) {
            back.emplace_back(p.x(), p.y());
        }
    }
}